

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hdr_set_version(bcf_hdr_t *hdr,char *version)

{
  bcf_hrec_t *pbVar1;
  char *pcVar2;
  bcf_hdr_t *h;
  int len;
  kstring_t str;
  int local_3c;
  int32_t local_38;
  int32_t iStack_34;
  int32_t iStack_30;
  undefined4 uStack_2c;
  bcf_idpair_t *local_28;
  
  pbVar1 = bcf_hdr_get_hrec(hdr,5,"fileformat",(char *)0x0,(char *)0x0);
  if (pbVar1 == (bcf_hrec_t *)0x0) {
    h = (bcf_hdr_t *)&stack0xffffffffffffffc8;
    local_38 = 0;
    iStack_34 = 0;
    iStack_30 = 0;
    uStack_2c = 0;
    local_28 = (bcf_idpair_t *)0x0;
    ksprintf((kstring_t *)h,"##fileformat=%s",version);
    bcf_hdr_parse_line(h,(char *)local_28,&local_3c);
    free(local_28);
  }
  else {
    free(pbVar1->value);
    pcVar2 = strdup(version);
    pbVar1->value = pcVar2;
  }
  hdr->dirty = 1;
  return;
}

Assistant:

void bcf_hdr_set_version(bcf_hdr_t *hdr, const char *version)
{
    bcf_hrec_t *hrec = bcf_hdr_get_hrec(hdr, BCF_HL_GEN, "fileformat", NULL, NULL);
    if ( !hrec )
    {
        int len;
        kstring_t str = {0,0,0};
        ksprintf(&str,"##fileformat=%s", version);
        hrec = bcf_hdr_parse_line(hdr, str.s, &len);
        free(str.s);
    }
    else
    {
        free(hrec->value);
        hrec->value = strdup(version);
    }
    hdr->dirty = 1;
}